

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldQueryPdu.cpp
# Opt level: O0

void __thiscall DIS::MinefieldQueryPdu::marshal(MinefieldQueryPdu *this,DataStream *dataStream)

{
  undefined8 uVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  undefined1 local_58 [8];
  TwoByteChunk x_1;
  size_t idx_1;
  undefined1 local_30 [8];
  Point x;
  size_t idx;
  DataStream *dataStream_local;
  MinefieldQueryPdu *this_local;
  
  MinefieldFamilyPdu::marshal(&this->super_MinefieldFamilyPdu,dataStream);
  EntityID::marshal(&this->_minefieldID,dataStream);
  EntityID::marshal(&this->_requestingEntityID,dataStream);
  DataStream::operator<<(dataStream,this->_requestID);
  sVar2 = std::vector<DIS::Point,_std::allocator<DIS::Point>_>::size
                    (&this->_requestedPerimeterPoints);
  DataStream::operator<<(dataStream,(uchar)sVar2);
  DataStream::operator<<(dataStream,this->_pad2);
  sVar2 = std::vector<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>::size
                    (&this->_sensorTypes);
  DataStream::operator<<(dataStream,(uchar)sVar2);
  DataStream::operator<<(dataStream,this->_dataFilter);
  EntityType::marshal(&this->_requestedMineType,dataStream);
  x._x = 0.0;
  x._y = 0.0;
  while( true ) {
    uVar1 = x._8_8_;
    sVar2 = std::vector<DIS::Point,_std::allocator<DIS::Point>_>::size
                      (&this->_requestedPerimeterPoints);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar3 = std::vector<DIS::Point,_std::allocator<DIS::Point>_>::operator[]
                       (&this->_requestedPerimeterPoints,x._8_8_);
    Point::Point((Point *)local_30,pvVar3);
    Point::marshal((Point *)local_30,dataStream);
    Point::~Point((Point *)local_30);
    x._8_8_ = x._8_8_ + 1;
  }
  x_1._otherParameters[0] = '\0';
  x_1._otherParameters[1] = '\0';
  x_1._10_6_ = 0;
  while( true ) {
    uVar1 = x_1._8_8_;
    sVar2 = std::vector<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>::size
                      (&this->_sensorTypes);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar4 = std::vector<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>::operator[]
                       (&this->_sensorTypes,x_1._8_8_);
    TwoByteChunk::TwoByteChunk((TwoByteChunk *)local_58,pvVar4);
    TwoByteChunk::marshal((TwoByteChunk *)local_58,dataStream);
    TwoByteChunk::~TwoByteChunk((TwoByteChunk *)local_58);
    x_1._8_8_ = x_1._8_8_ + 1;
  }
  return;
}

Assistant:

void MinefieldQueryPdu::marshal(DataStream& dataStream) const
{
    MinefieldFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _minefieldID.marshal(dataStream);
    _requestingEntityID.marshal(dataStream);
    dataStream << _requestID;
    dataStream << ( unsigned char )_requestedPerimeterPoints.size();
    dataStream << _pad2;
    dataStream << ( unsigned char )_sensorTypes.size();
    dataStream << _dataFilter;
    _requestedMineType.marshal(dataStream);

     for(size_t idx = 0; idx < _requestedPerimeterPoints.size(); idx++)
     {
        Point x = _requestedPerimeterPoints[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _sensorTypes.size(); idx++)
     {
        TwoByteChunk x = _sensorTypes[idx];
        x.marshal(dataStream);
     }

}